

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O2

bool __thiscall sptk::Matrix::Transpose(Matrix *this,Matrix *transposed_matrix)

{
  pointer ppdVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  uint num_column;
  ulong uVar6;
  bool bVar7;
  ulong uVar8;
  
  bVar7 = this != transposed_matrix && transposed_matrix != (Matrix *)0x0;
  if (this == transposed_matrix || transposed_matrix == (Matrix *)0x0) {
    return bVar7;
  }
  uVar2 = transposed_matrix->num_row_;
  if (uVar2 == this->num_column_) {
    uVar4 = transposed_matrix->num_column_;
    num_column = this->num_row_;
    if (uVar4 == num_column) goto LAB_0010ab6f;
  }
  else {
    num_column = this->num_row_;
  }
  Resize(transposed_matrix,this->num_column_,num_column);
  uVar4 = this->num_row_;
  uVar2 = this->num_column_;
LAB_0010ab6f:
  uVar6 = 0;
  uVar5 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar5 = uVar6;
  }
  uVar3 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar3 = uVar6;
  }
  for (; uVar6 != uVar3; uVar6 = uVar6 + 1) {
    ppdVar1 = (this->index_).super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
      (transposed_matrix->index_).super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar6][uVar8] = ppdVar1[uVar8][uVar6];
    }
  }
  return bVar7;
}

Assistant:

bool Matrix::Transpose(Matrix* transposed_matrix) const {
  if (NULL == transposed_matrix || this == transposed_matrix) {
    return false;
  }

  if (transposed_matrix->num_row_ != num_column_ ||
      transposed_matrix->num_column_ != num_row_) {
    transposed_matrix->Resize(num_column_, num_row_);
  }

  for (int i(0); i < num_column_; ++i) {
    for (int j(0); j < num_row_; ++j) {
      transposed_matrix->index_[i][j] = index_[j][i];
    }
  }

  return true;
}